

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pokey.c
# Opt level: O2

void device_reset_pokey(void *info)

{
  long lVar1;
  
  for (lVar1 = -4; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(undefined4 *)((long)info + lVar1 * 4 + 0x18) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + 0x28) = 4;
    *(undefined4 *)((long)info + lVar1 * 4 + 0x38) = 0;
    *(undefined1 *)((long)info + lVar1 + 0x3c) = 0;
    *(undefined1 *)((long)info + lVar1 + 0x40) = 0;
  }
  *(undefined8 *)((long)info + 0x58) = 0;
  *(undefined8 *)((long)info + 0x60) = 0;
  *(undefined8 *)((long)info + 0x48) = 0;
  *(undefined8 *)((long)info + 0x50) = 0;
  *(undefined8 *)((long)info + 0x68) = 0x1c00000000;
  return;
}

Assistant:

static void device_reset_pokey(void *info)
{
	pokey_state *chip = (pokey_state *)info;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 4; CurChn ++)
	{
		chip->counter[CurChn] = 0;
		chip->divisor[CurChn] = 4;
		chip->volume[CurChn] = 0;
		chip->output[CurChn] = 0;
		chip->audible[CurChn] = 0;
	}
	chip->samplepos_fract = 0;
	chip->samplepos_whole = 0;
	chip->polyadjust = 0;
	chip->p4 = 0;
	chip->p5 = 0;
	chip->p9 = 0;
	chip->p17 = 0;
	chip->r9 = 0;
	chip->r17 = 0;
	chip->clockmult = DIV_64;
	
	return;
}